

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O2

void learn_brand_slay_helper
               (player *p,object *obj1,object *obj2,monster_conflict *mon,_Bool allow_off,
               _Bool allow_temp)

{
  brand_conflict *pbVar1;
  _Bool _Var2;
  monster_lore *lore;
  object *poVar3;
  ulong uVar4;
  wchar_t wVar5;
  slay_conflict *slay;
  byte bVar6;
  
  lore = get_lore(mon->race);
  uVar4 = 1;
  do {
    if (z_info->brand_max <= uVar4) {
      for (uVar4 = 1; uVar4 < z_info->slay_max; uVar4 = uVar4 + 1) {
        if ((obj1 == (object *)0x0) || (obj1->slays == (_Bool *)0x0)) {
          bVar6 = 0;
        }
        else {
          bVar6 = obj1->slays[uVar4];
        }
        if (((obj2 != (object *)0x0) && (obj2->slays != (_Bool *)0x0)) &&
           (obj2->slays[uVar4] != false)) {
          bVar6 = 1;
        }
        if (allow_off) {
          for (wVar5 = L'\0'; (uint)wVar5 < (uint)(p->body).count; wVar5 = wVar5 + L'\x01') {
            poVar3 = slot_object(p,wVar5);
            if (((poVar3 != (object *)0x0) && (poVar3->slays != (_Bool *)0x0)) &&
               ((poVar3->slays[uVar4] == true &&
                ((_Var2 = tval_is_weapon(poVar3), !_Var2 &&
                 (_Var2 = tval_is_launcher(poVar3), !_Var2)))))) {
              bVar6 = 1;
            }
          }
        }
        wVar5 = (wchar_t)uVar4;
        if (((bVar6 & 1) != 0) ||
           ((allow_temp && (_Var2 = player_has_temporary_slay(p,wVar5), _Var2)))) {
          slay = slays + uVar4;
          _Var2 = react_to_specific_slay(slay,mon);
          if (_Var2) {
            if (slay->race_flag != L'\0') {
              lore_learn_flag_if_visible(lore,(monster *)mon,slay->race_flag);
            }
            _Var2 = monster_is_visible((monster *)mon);
            if ((_Var2) && ((bVar6 & 1) != 0)) {
              player_learn_slay(p,wVar5);
            }
          }
          else {
            _Var2 = player_knows_slay(p,wVar5);
            if ((_Var2) && (slay->race_flag != L'\0')) {
              lore_learn_flag_if_visible(lore,(monster *)mon,slay->race_flag);
            }
          }
        }
      }
      return;
    }
    if ((obj1 == (object *)0x0) || (obj1->brands == (_Bool *)0x0)) {
      bVar6 = 0;
    }
    else {
      bVar6 = obj1->brands[uVar4];
    }
    if (((obj2 != (object *)0x0) && (obj2->brands != (_Bool *)0x0)) &&
       (obj2->brands[uVar4] != false)) {
      bVar6 = 1;
    }
    if (allow_off) {
      for (wVar5 = L'\0'; (uint)wVar5 < (uint)(p->body).count; wVar5 = wVar5 + L'\x01') {
        poVar3 = slot_object(p,wVar5);
        if (((poVar3 != (object *)0x0) && (poVar3->brands != (_Bool *)0x0)) &&
           ((poVar3->brands[uVar4] == true &&
            ((_Var2 = tval_is_weapon(poVar3), !_Var2 && (_Var2 = tval_is_launcher(poVar3), !_Var2)))
            ))) {
          bVar6 = 1;
        }
      }
    }
    wVar5 = (wchar_t)uVar4;
    if (((bVar6 & 1) != 0) || ((allow_temp && (_Var2 = player_has_temporary_brand(p,wVar5), _Var2)))
       ) {
      pbVar1 = brands;
      if ((brands[uVar4].resist_flag == 0) ||
         (_Var2 = flag_has_dbg(mon->race->flags,0xc,brands[uVar4].resist_flag,"mon->race->flags",
                               "b->resist_flag"), !_Var2)) {
        if ((bVar6 & 1) != 0) {
          player_learn_brand(p,wVar5);
        }
        if (pbVar1[uVar4].resist_flag != L'\0') {
          lore_learn_flag_if_visible(lore,(monster *)mon,pbVar1[uVar4].resist_flag);
        }
        wVar5 = pbVar1[uVar4].vuln_flag;
        if (wVar5 != L'\0') goto LAB_001a2d3e;
      }
      else {
        _Var2 = player_knows_brand(p,wVar5);
        if (_Var2) {
          wVar5 = pbVar1[uVar4].resist_flag;
LAB_001a2d3e:
          lore_learn_flag_if_visible(lore,(monster *)mon,wVar5);
        }
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static void learn_brand_slay_helper(struct player *p, struct object *obj1,
		struct object *obj2, const struct monster *mon, bool allow_off,
		bool allow_temp)
{
	struct monster_lore *lore = get_lore(mon->race);
	int i;

	/* Handle brands. */
	for (i = 1; i < z_info->brand_max; i++) {
		int j;
		struct brand *b;
		bool learn = false;

		/* Check the objects directly involved. */
		if (obj1 && obj1->brands && obj1->brands[i]) {
			learn = true;
		}
		if (obj2 && obj2->brands && obj2->brands[i]) {
			learn = true;
		}

		/* Check for an off-weapon brand. */
		if (allow_off) {
			for (j = 0; j < p->body.count; ++j) {
				struct object *obj = slot_object(p, j);

				if (obj && obj->brands && obj->brands[i]
						&& !tval_is_weapon(obj)
						&& !tval_is_launcher(obj)) {
					learn = true;
				}
			}
		}

		/*
		 * Check for the temporary brand (only relevant if the brand
		 * is not already present).
		 */
		if (!learn && !(allow_temp && player_has_temporary_brand(p, i))) {
			continue;
		}

		b = &brands[i];
		if (!b->resist_flag || !rf_has(mon->race->flags, b->resist_flag)) {
			/* Learn the brand */
			if (learn) {
				player_learn_brand(p, i);
			}

			/* Learn about the monster. */
			if (b->resist_flag) {
				lore_learn_flag_if_visible(lore, mon,
					b->resist_flag);
			}
			if (b->vuln_flag) {
				lore_learn_flag_if_visible(lore, mon,
					b->vuln_flag);
			}
		} else if (player_knows_brand(p, i)) {
			/* Learn about the monster. */
			lore_learn_flag_if_visible(lore, mon, b->resist_flag);
		}
	}

	/* Handle slays. */
	for (i = 1; i < z_info->slay_max; ++i) {
		int j;
		struct slay *s;
		bool learn = false;

		/* Check the objects directly involved. */
		if (obj1 && obj1->slays && obj1->slays[i]) {
			learn = true;
		}
		if (obj2 && obj2->slays && obj2->slays[i]) {
			learn = true;
		}

		/* Check for an off-weapon slay. */
		if (allow_off) {
			for (j = 0; j < p->body.count; ++j) {
				struct object *obj = slot_object(p, j);

				if (obj && obj->slays && obj->slays[i]
						&& !tval_is_weapon(obj)
						&& !tval_is_launcher(obj)) {
					learn = true;
				}
			}
		}

		/*
		 * Check for the temporary slay (only relevant if the slay
		 * is not already present.
		 */
		if (!learn && !(allow_temp && player_has_temporary_slay(p, i))) {
			continue;
		}

		s = &slays[i];
		if (react_to_specific_slay(s, mon)) {
			/* Learn about the monster. */
			if (s->race_flag) {
				lore_learn_flag_if_visible(lore, mon,
					s->race_flag);
			}
			if (monster_is_visible(mon)) {
				/* Learn the slay */
				if (learn) {
					player_learn_slay(p, i);
				}
			}
		} else if (player_knows_slay(p, i)) {
			/* Learn about unaffected monsters. */
			if (s->race_flag) {
				lore_learn_flag_if_visible(lore, mon,
					s->race_flag);
			}
		}
	}
}